

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

string * cmIfCommandError_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *args)

{
  pointer pcVar1;
  string *psVar2;
  WrapQuotes in_R8D;
  cmExpandedCommandArgument *i;
  pointer this;
  string_view str;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"given arguments:\n ","");
  this = (args->
         super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (args->
           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this != pcVar1) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(this);
      str._M_str = (char *)0x0;
      str._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_50,(cmOutputConverter *)psVar2->_M_string_length,str,in_R8D);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this = this + 1;
    } while (this != pcVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmIfCommandError(
  std::vector<cmExpandedCommandArgument> const& args)
{
  std::string err = "given arguments:\n ";
  for (cmExpandedCommandArgument const& i : args) {
    err += " ";
    err += cmOutputConverter::EscapeForCMake(i.GetValue());
  }
  err += "\n";
  return err;
}